

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O3

bool ValidateXrEnum(GenValidUsageXrInstanceInfo *instance_info,string *command_name,
                   string *validation_name,string *item_name,
                   vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                   *objects_info,XrFaceExpression2FB value)

{
  pointer pbVar1;
  int iVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *enabled_extension;
  pointer pbVar3;
  bool bVar4;
  string vuid;
  string error_str;
  string local_a0;
  string *local_80;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *local_78;
  string *local_70;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_68;
  string local_50;
  
  if (instance_info == (GenValidUsageXrInstanceInfo *)0x0) {
LAB_00148a2b:
    bVar4 = value < (XR_FACE_EXPRESSION2_COUNT_FB|XR_FACE_EXPRESSION2_BROW_LOWERER_R_FB);
  }
  else {
    pbVar1 = (instance_info->enabled_extensions).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_80 = command_name;
    local_70 = item_name;
    local_78 = objects_info;
    for (pbVar3 = (instance_info->enabled_extensions).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pbVar3 != pbVar1; pbVar3 = pbVar3 + 1)
    {
      iVar2 = std::__cxx11::string::compare((char *)pbVar3);
      if (iVar2 == 0) goto LAB_00148a2b;
    }
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"VUID-","");
    std::__cxx11::string::_M_append((char *)&local_a0,(ulong)(validation_name->_M_dataplus)._M_p);
    std::__cxx11::string::append((char *)&local_a0);
    std::__cxx11::string::_M_append((char *)&local_a0,(ulong)(local_70->_M_dataplus)._M_p);
    std::__cxx11::string::append((char *)&local_a0);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"XrFaceExpression2FB requires extension ","");
    std::__cxx11::string::append((char *)&local_50);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              (&local_68,local_78);
    CoreValidLogMessage(instance_info,&local_a0,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_80,&local_68,
                        &local_50);
    if (local_68.
        super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_68.
                      super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_68.
                            super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_68.
                            super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool ValidateXrEnum(GenValidUsageXrInstanceInfo *instance_info,
                    const std::string &command_name,
                    const std::string &validation_name,
                    const std::string &item_name,
                    std::vector<GenValidUsageXrObjectInfo>& objects_info,
                    const XrFaceExpression2FB value) {
    (void)instance_info;  // quiet warnings
    (void)command_name;  // quiet warnings
    (void)validation_name;  // quiet warnings
    (void)item_name;  // quiet warnings
    (void)objects_info;  // quiet warnings
    // Enum requires extension XR_FB_face_tracking2, so check that it is enabled
    if (nullptr != instance_info && !ExtensionEnabled(instance_info->enabled_extensions, "XR_FB_face_tracking2")) {
        std::string vuid = "VUID-";
        vuid += validation_name;
        vuid += "-";
        vuid += item_name;
        vuid += "-parameter";
        std::string error_str = "XrFaceExpression2FB requires extension ";
        error_str += " \"XR_FB_face_tracking2\" to be enabled, but it is not enabled";
        CoreValidLogMessage(instance_info, vuid,
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info, error_str);
        return false;
    }
    switch (value) {
        case XR_FACE_EXPRESSION2_BROW_LOWERER_L_FB:
            return true;
        case XR_FACE_EXPRESSION2_BROW_LOWERER_R_FB:
            return true;
        case XR_FACE_EXPRESSION2_CHEEK_PUFF_L_FB:
            return true;
        case XR_FACE_EXPRESSION2_CHEEK_PUFF_R_FB:
            return true;
        case XR_FACE_EXPRESSION2_CHEEK_RAISER_L_FB:
            return true;
        case XR_FACE_EXPRESSION2_CHEEK_RAISER_R_FB:
            return true;
        case XR_FACE_EXPRESSION2_CHEEK_SUCK_L_FB:
            return true;
        case XR_FACE_EXPRESSION2_CHEEK_SUCK_R_FB:
            return true;
        case XR_FACE_EXPRESSION2_CHIN_RAISER_B_FB:
            return true;
        case XR_FACE_EXPRESSION2_CHIN_RAISER_T_FB:
            return true;
        case XR_FACE_EXPRESSION2_DIMPLER_L_FB:
            return true;
        case XR_FACE_EXPRESSION2_DIMPLER_R_FB:
            return true;
        case XR_FACE_EXPRESSION2_EYES_CLOSED_L_FB:
            return true;
        case XR_FACE_EXPRESSION2_EYES_CLOSED_R_FB:
            return true;
        case XR_FACE_EXPRESSION2_EYES_LOOK_DOWN_L_FB:
            return true;
        case XR_FACE_EXPRESSION2_EYES_LOOK_DOWN_R_FB:
            return true;
        case XR_FACE_EXPRESSION2_EYES_LOOK_LEFT_L_FB:
            return true;
        case XR_FACE_EXPRESSION2_EYES_LOOK_LEFT_R_FB:
            return true;
        case XR_FACE_EXPRESSION2_EYES_LOOK_RIGHT_L_FB:
            return true;
        case XR_FACE_EXPRESSION2_EYES_LOOK_RIGHT_R_FB:
            return true;
        case XR_FACE_EXPRESSION2_EYES_LOOK_UP_L_FB:
            return true;
        case XR_FACE_EXPRESSION2_EYES_LOOK_UP_R_FB:
            return true;
        case XR_FACE_EXPRESSION2_INNER_BROW_RAISER_L_FB:
            return true;
        case XR_FACE_EXPRESSION2_INNER_BROW_RAISER_R_FB:
            return true;
        case XR_FACE_EXPRESSION2_JAW_DROP_FB:
            return true;
        case XR_FACE_EXPRESSION2_JAW_SIDEWAYS_LEFT_FB:
            return true;
        case XR_FACE_EXPRESSION2_JAW_SIDEWAYS_RIGHT_FB:
            return true;
        case XR_FACE_EXPRESSION2_JAW_THRUST_FB:
            return true;
        case XR_FACE_EXPRESSION2_LID_TIGHTENER_L_FB:
            return true;
        case XR_FACE_EXPRESSION2_LID_TIGHTENER_R_FB:
            return true;
        case XR_FACE_EXPRESSION2_LIP_CORNER_DEPRESSOR_L_FB:
            return true;
        case XR_FACE_EXPRESSION2_LIP_CORNER_DEPRESSOR_R_FB:
            return true;
        case XR_FACE_EXPRESSION2_LIP_CORNER_PULLER_L_FB:
            return true;
        case XR_FACE_EXPRESSION2_LIP_CORNER_PULLER_R_FB:
            return true;
        case XR_FACE_EXPRESSION2_LIP_FUNNELER_LB_FB:
            return true;
        case XR_FACE_EXPRESSION2_LIP_FUNNELER_LT_FB:
            return true;
        case XR_FACE_EXPRESSION2_LIP_FUNNELER_RB_FB:
            return true;
        case XR_FACE_EXPRESSION2_LIP_FUNNELER_RT_FB:
            return true;
        case XR_FACE_EXPRESSION2_LIP_PRESSOR_L_FB:
            return true;
        case XR_FACE_EXPRESSION2_LIP_PRESSOR_R_FB:
            return true;
        case XR_FACE_EXPRESSION2_LIP_PUCKER_L_FB:
            return true;
        case XR_FACE_EXPRESSION2_LIP_PUCKER_R_FB:
            return true;
        case XR_FACE_EXPRESSION2_LIP_STRETCHER_L_FB:
            return true;
        case XR_FACE_EXPRESSION2_LIP_STRETCHER_R_FB:
            return true;
        case XR_FACE_EXPRESSION2_LIP_SUCK_LB_FB:
            return true;
        case XR_FACE_EXPRESSION2_LIP_SUCK_LT_FB:
            return true;
        case XR_FACE_EXPRESSION2_LIP_SUCK_RB_FB:
            return true;
        case XR_FACE_EXPRESSION2_LIP_SUCK_RT_FB:
            return true;
        case XR_FACE_EXPRESSION2_LIP_TIGHTENER_L_FB:
            return true;
        case XR_FACE_EXPRESSION2_LIP_TIGHTENER_R_FB:
            return true;
        case XR_FACE_EXPRESSION2_LIPS_TOWARD_FB:
            return true;
        case XR_FACE_EXPRESSION2_LOWER_LIP_DEPRESSOR_L_FB:
            return true;
        case XR_FACE_EXPRESSION2_LOWER_LIP_DEPRESSOR_R_FB:
            return true;
        case XR_FACE_EXPRESSION2_MOUTH_LEFT_FB:
            return true;
        case XR_FACE_EXPRESSION2_MOUTH_RIGHT_FB:
            return true;
        case XR_FACE_EXPRESSION2_NOSE_WRINKLER_L_FB:
            return true;
        case XR_FACE_EXPRESSION2_NOSE_WRINKLER_R_FB:
            return true;
        case XR_FACE_EXPRESSION2_OUTER_BROW_RAISER_L_FB:
            return true;
        case XR_FACE_EXPRESSION2_OUTER_BROW_RAISER_R_FB:
            return true;
        case XR_FACE_EXPRESSION2_UPPER_LID_RAISER_L_FB:
            return true;
        case XR_FACE_EXPRESSION2_UPPER_LID_RAISER_R_FB:
            return true;
        case XR_FACE_EXPRESSION2_UPPER_LIP_RAISER_L_FB:
            return true;
        case XR_FACE_EXPRESSION2_UPPER_LIP_RAISER_R_FB:
            return true;
        case XR_FACE_EXPRESSION2_TONGUE_TIP_INTERDENTAL_FB:
            return true;
        case XR_FACE_EXPRESSION2_TONGUE_TIP_ALVEOLAR_FB:
            return true;
        case XR_FACE_EXPRESSION2_TONGUE_FRONT_DORSAL_PALATE_FB:
            return true;
        case XR_FACE_EXPRESSION2_TONGUE_MID_DORSAL_PALATE_FB:
            return true;
        case XR_FACE_EXPRESSION2_TONGUE_BACK_DORSAL_VELAR_FB:
            return true;
        case XR_FACE_EXPRESSION2_TONGUE_OUT_FB:
            return true;
        case XR_FACE_EXPRESSION2_TONGUE_RETREAT_FB:
            return true;
        case XR_FACE_EXPRESSION2_COUNT_FB:
            return true;
    default:
        return false;
}
}